

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

QMatrix3x3 *
QOpenGLTextureBlitter::sourceTransform
          (QMatrix3x3 *__return_storage_ptr__,QRectF *subTexture,QSize *textureSize,Origin origin)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_28;
  
  dVar1 = subTexture->w;
  dVar3 = (double)(textureSize->ht).m_i;
  local_28 = subTexture->h / dVar3;
  dVar2 = subTexture->xp;
  dVar3 = subTexture->yp / dVar3;
  if (origin == OriginTopLeft) {
    local_28 = -local_28;
    dVar3 = 1.0 - dVar3;
  }
  dVar4 = (double)(textureSize->wd).m_i;
  __return_storage_ptr__->m[1][1] = -NAN;
  __return_storage_ptr__->m[1][2] = -NAN;
  __return_storage_ptr__->m[2][0] = -NAN;
  __return_storage_ptr__->m[2][1] = -NAN;
  __return_storage_ptr__->m[0][0] = -NAN;
  __return_storage_ptr__->m[0][1] = -NAN;
  __return_storage_ptr__->m[0][2] = -NAN;
  __return_storage_ptr__->m[1][0] = -NAN;
  __return_storage_ptr__->m[2][2] = -NAN;
  QGenericMatrix<3,_3,_float>::setToIdentity(__return_storage_ptr__);
  *(ulong *)__return_storage_ptr__->m[2] = CONCAT44((float)dVar3,(float)(dVar2 / dVar4));
  __return_storage_ptr__->m[0][0] = (float)(dVar1 / dVar4);
  __return_storage_ptr__->m[1][1] = (float)local_28;
  return __return_storage_ptr__;
}

Assistant:

QMatrix3x3 QOpenGLTextureBlitter::sourceTransform(const QRectF &subTexture,
                                                  const QSize &textureSize,
                                                  Origin origin)
{
    qreal x_scale = subTexture.width() / textureSize.width();
    qreal y_scale = subTexture.height() / textureSize.height();

    const QPointF topLeft = subTexture.topLeft();
    qreal x_translate = topLeft.x() / textureSize.width();
    qreal y_translate = topLeft.y() / textureSize.height();

    if (origin == OriginTopLeft) {
        y_scale = -y_scale;
        y_translate = 1 - y_translate;
    }

    QMatrix3x3 matrix;
    matrix(0,2) = x_translate;
    matrix(1,2) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}